

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileApprover.cpp
# Opt level: O0

int ApprovalTests::FileApprover::verify
              (EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  int extraout_EAX;
  element_type *siglen_00;
  
  ComparatorFactory::getComparatorForFile((string *)ctx);
  siglen_00 = ::std::
              __shared_ptr_access<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)ctx);
  verify(ctx,sig,(size_t)siglen_00,tbs,tbslen);
  ::std::shared_ptr<ApprovalTests::ApprovalComparator>::~shared_ptr
            ((shared_ptr<ApprovalTests::ApprovalComparator> *)0x143b17);
  return extraout_EAX;
}

Assistant:

void FileApprover::verify(const std::string& receivedPath,
                              const std::string& approvedPath)
    {
        verify(receivedPath,
               approvedPath,
               *ComparatorFactory::getComparatorForFile(receivedPath));
    }